

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmGetTotalArgumentSize(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  
  if (argc < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      if (argv[uVar3] != (char *)0x0) {
        sVar1 = strlen(argv[uVar3]);
        iVar2 = iVar2 + (int)sVar1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  return iVar2;
}

Assistant:

int CCONV cmGetTotalArgumentSize(int argc, char** argv)
{
  int i;
  int result = 0;
  for (i = 0; i < argc; ++i) {
    if (argv[i]) {
      result = result + static_cast<int>(strlen(argv[i]));
    }
  }
  return result;
}